

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_complete(char *zSql)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char *zRight;
  long lVar8;
  long lVar9;
  byte bVar10;
  bool bVar11;
  long lStack_40;
  
  bVar10 = 0;
  do {
    lStack_40 = 2;
    lVar9 = 1;
    bVar4 = *zSql;
    lVar8 = lVar9;
    if (((1 < bVar4 - 9) && (1 < bVar4 - 0xc)) && (bVar4 != 0x20)) {
      lVar8 = lStack_40;
      if ((bVar4 == 0x22) || (bVar4 == 0x27)) {
LAB_0011f272:
        do {
          bVar2 = ((byte *)zSql)[1];
          zSql = (char *)((byte *)zSql + 1);
          if (bVar2 == 0) break;
        } while (bVar2 != bVar4);
        if (bVar2 == 0) {
LAB_0011f442:
          bVar11 = false;
LAB_0011f44d:
          return (int)bVar11;
        }
      }
      else if (bVar4 == 0x2d) {
        if (((byte *)zSql)[1] == 0x2d) {
          bVar4 = 0x2d;
          while( true ) {
            if (bVar4 == 0) goto LAB_0011f446;
            lVar8 = lVar9;
            if (bVar4 == 10) break;
            bVar4 = ((byte *)zSql)[1];
            zSql = (char *)((byte *)zSql + 1);
          }
        }
      }
      else if (bVar4 == 0x2f) {
        if (((byte *)zSql)[1] == 0x2a) {
          zSql = (char *)((byte *)zSql + 3);
          do {
            if (((byte *)zSql)[-1] == 0x2a) {
              lVar8 = lVar9;
              if (*zSql == 0x2f) break;
            }
            else if (((byte *)zSql)[-1] == 0) goto LAB_0011f442;
            zSql = (char *)((byte *)zSql + 1);
          } while( true );
        }
      }
      else if (bVar4 == 0x3b) {
        lVar8 = 0;
      }
      else {
        uVar5 = (uint)bVar4;
        if (uVar5 == 0x5b) {
          do {
            pbVar1 = (byte *)zSql + 1;
            if (*pbVar1 == 0) goto LAB_0011f442;
            zSql = (char *)((byte *)zSql + 1);
          } while (*pbVar1 != 0x5d);
        }
        else {
          if (uVar5 == 0x60) goto LAB_0011f272;
          if (uVar5 == 0) {
LAB_0011f446:
            bVar11 = bVar10 == 1;
            goto LAB_0011f44d;
          }
          if ((""[bVar4] & 0x46) == 0) goto LAB_0011f427;
          lVar8 = 0;
          lVar9 = -0x100000000;
          do {
            lVar9 = lVar9 + 0x100000000;
            lVar3 = lVar8 + 1;
            lVar8 = lVar8 + 1;
          } while ((""[((byte *)zSql)[lVar3]] & 0x46) != 0);
          uVar7 = (ulong)(uVar5 - 0x43);
          if (uVar5 - 0x43 < 0x32) {
            if ((0x100000001U >> (uVar7 & 0x3f) & 1) == 0) {
              iVar6 = (int)lVar8;
              if ((0x400000004U >> (uVar7 & 0x3f) & 1) == 0) {
                if ((0x2000000020000U >> (uVar7 & 0x3f) & 1) == 0) goto LAB_0011f420;
                if (iVar6 == 4) {
                  zRight = "temp";
                  iVar6 = 4;
                }
                else {
                  if (iVar6 != 9) {
                    if (iVar6 != 7) goto LAB_0011f41d;
                    iVar6 = sqlite3_strnicmp(zSql,"trigger",7);
                    lStack_40 = 6;
                    goto LAB_0011f418;
                  }
                  zRight = "temporary";
                  iVar6 = 9;
                }
                iVar6 = sqlite3_strnicmp(zSql,zRight,iVar6);
                lStack_40 = 5;
              }
              else if (iVar6 == 7) {
                iVar6 = sqlite3_strnicmp(zSql,"explain",7);
                lStack_40 = 3;
              }
              else {
                if (iVar6 != 3) goto LAB_0011f41d;
                iVar6 = sqlite3_strnicmp(zSql,"end",3);
                lStack_40 = 7;
              }
LAB_0011f418:
              if (iVar6 == 0) goto LAB_0011f420;
            }
            else if (lVar8 == 6) {
              iVar6 = sqlite3_strnicmp(zSql,"create",6);
              lStack_40 = 4;
              goto LAB_0011f418;
            }
LAB_0011f41d:
            lStack_40 = 2;
          }
LAB_0011f420:
          zSql = (char *)((byte *)zSql + (lVar9 >> 0x20));
          lVar8 = lStack_40;
        }
      }
    }
LAB_0011f427:
    bVar10 = sqlite3_complete::trans[bVar10][lVar8];
    zSql = (char *)((byte *)zSql + 1);
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_complete(const char *zSql){
  u8 state = 0;   /* Current state, using numbers defined in header comment */
  u8 token;       /* Value of the next token */

#ifndef SQLITE_OMIT_TRIGGER
  /* A complex statement machine used to detect the end of a CREATE TRIGGER
  ** statement.  This is the normal case.
  */
  static const u8 trans[8][8] = {
                     /* Token:                                                */
     /* State:       **  SEMI  WS  OTHER  EXPLAIN  CREATE  TEMP  TRIGGER  END */
     /* 0 INVALID: */ {    1,  0,     2,       3,      4,    2,       2,   2, },
     /* 1   START: */ {    1,  1,     2,       3,      4,    2,       2,   2, },
     /* 2  NORMAL: */ {    1,  2,     2,       2,      2,    2,       2,   2, },
     /* 3 EXPLAIN: */ {    1,  3,     3,       2,      4,    2,       2,   2, },
     /* 4  CREATE: */ {    1,  4,     2,       2,      2,    4,       5,   2, },
     /* 5 TRIGGER: */ {    6,  5,     5,       5,      5,    5,       5,   5, },
     /* 6    SEMI: */ {    6,  6,     5,       5,      5,    5,       5,   7, },
     /* 7     END: */ {    1,  7,     5,       5,      5,    5,       5,   5, },
  };
#else
  /* If triggers are not supported by this compile then the statement machine
  ** used to detect the end of a statement is much simpler
  */
  static const u8 trans[3][3] = {
                     /* Token:           */
     /* State:       **  SEMI  WS  OTHER */
     /* 0 INVALID: */ {    1,  0,     2, },
     /* 1   START: */ {    1,  1,     2, },
     /* 2  NORMAL: */ {    1,  2,     2, },
  };
#endif /* SQLITE_OMIT_TRIGGER */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( zSql==0 ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif

  while( *zSql ){
    switch( *zSql ){
      case ';': {  /* A semicolon */
        token = tkSEMI;
        break;
      }
      case ' ':
      case '\r':
      case '\t':
      case '\n':
      case '\f': {  /* White space is ignored */
        token = tkWS;
        break;
      }
      case '/': {   /* C-style comments */
        if( zSql[1]!='*' ){
          token = tkOTHER;
          break;
        }
        zSql += 2;
        while( zSql[0] && (zSql[0]!='*' || zSql[1]!='/') ){ zSql++; }
        if( zSql[0]==0 ) return 0;
        zSql++;
        token = tkWS;
        break;
      }
      case '-': {   /* SQL-style comments from "--" to end of line */
        if( zSql[1]!='-' ){
          token = tkOTHER;
          break;
        }
        while( *zSql && *zSql!='\n' ){ zSql++; }
        if( *zSql==0 ) return state==1;
        token = tkWS;
        break;
      }
      case '[': {   /* Microsoft-style identifiers in [...] */
        zSql++;
        while( *zSql && *zSql!=']' ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      case '`':     /* Grave-accent quoted symbols used by MySQL */
      case '"':     /* single- and double-quoted strings */
      case '\'': {
        int c = *zSql;
        zSql++;
        while( *zSql && *zSql!=c ){ zSql++; }
        if( *zSql==0 ) return 0;
        token = tkOTHER;
        break;
      }
      default: {
#ifdef SQLITE_EBCDIC
        unsigned char c;
#endif
        if( IdChar((u8)*zSql) ){
          /* Keywords and unquoted identifiers */
          int nId;
          for(nId=1; IdChar(zSql[nId]); nId++){}
#ifdef SQLITE_OMIT_TRIGGER
          token = tkOTHER;
#else
          switch( *zSql ){
            case 'c': case 'C': {
              if( nId==6 && sqlite3StrNICmp(zSql, "create", 6)==0 ){
                token = tkCREATE;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 't': case 'T': {
              if( nId==7 && sqlite3StrNICmp(zSql, "trigger", 7)==0 ){
                token = tkTRIGGER;
              }else if( nId==4 && sqlite3StrNICmp(zSql, "temp", 4)==0 ){
                token = tkTEMP;
              }else if( nId==9 && sqlite3StrNICmp(zSql, "temporary", 9)==0 ){
                token = tkTEMP;
              }else{
                token = tkOTHER;
              }
              break;
            }
            case 'e':  case 'E': {
              if( nId==3 && sqlite3StrNICmp(zSql, "end", 3)==0 ){
                token = tkEND;
              }else
#ifndef SQLITE_OMIT_EXPLAIN
              if( nId==7 && sqlite3StrNICmp(zSql, "explain", 7)==0 ){
                token = tkEXPLAIN;
              }else
#endif
              {
                token = tkOTHER;
              }
              break;
            }
            default: {
              token = tkOTHER;
              break;
            }
          }
#endif /* SQLITE_OMIT_TRIGGER */
          zSql += nId-1;
        }else{
          /* Operators and special symbols */
          token = tkOTHER;
        }
        break;
      }
    }
    state = trans[state][token];
    zSql++;
  }
  return state==1;
}